

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_tree_renderer.cpp
# Opt level: O2

void __thiscall
duckdb::TextTreeRenderer::SplitStringBuffer
          (TextTreeRenderer *this,string *source,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *result)

{
  byte bVar1;
  idx_t iVar2;
  char *s;
  ulong len;
  uint uVar3;
  size_t sVar4;
  size_t sVar5;
  ulong pos;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  iVar2 = (this->config).node_render_width;
  s = (source->_M_dataplus)._M_p;
  len = source->_M_string_length;
  uVar8 = 0;
  lVar6 = 0;
  local_78 = 0;
  pos = 0;
  while (pos < len) {
    sVar4 = Utf8Proc::RenderWidth(s,len,pos);
    sVar5 = Utf8Proc::NextGraphemeCluster(s,len,pos);
    uVar7 = pos;
    if (iVar2 - 2 < lVar6 + sVar4) {
      uVar7 = uVar8;
      if (uVar8 < local_78 + 8) {
        uVar7 = pos;
      }
      ::std::__cxx11::string::substr((ulong)&local_50,(ulong)source);
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)result,
                 &local_50);
      ::std::__cxx11::string::~string((string *)&local_50);
      lVar6 = pos - uVar7;
      uVar8 = uVar7;
      local_78 = uVar7;
    }
    bVar1 = (source->_M_dataplus)._M_p[uVar7];
    if (((char)bVar1 < '0') ||
       ((uVar3 = bVar1 - 0x3a, uVar3 < 0x27 && ((0x5e0000007fU >> ((ulong)uVar3 & 0x3f) & 1) != 0)))
       ) {
      uVar8 = uVar7;
    }
    lVar6 = lVar6 + sVar4;
    pos = sVar5;
  }
  if (local_78 < len) {
    ::std::__cxx11::string::substr((ulong)&local_50,(ulong)source);
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)result,&local_50
              );
    ::std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void TextTreeRenderer::SplitStringBuffer(const string &source, vector<string> &result) {
	D_ASSERT(Utf8Proc::IsValid(source.c_str(), source.size()));
	const idx_t max_line_render_size = config.node_render_width - 2;
	// utf8 in prompt, get render width
	idx_t character_pos = 0;
	idx_t start_pos = 0;
	idx_t render_width = 0;
	idx_t last_possible_split = 0;

	const idx_t size = source.size();
	const char *input = source.c_str();

	while (character_pos < size) {
		size_t char_render_width = Utf8Proc::RenderWidth(input, size, character_pos);
		idx_t next_character_pos = Utf8Proc::NextGraphemeCluster(input, size, character_pos);

		// Does the next character make us exceed the line length?
		if (render_width + char_render_width > max_line_render_size) {
			if (start_pos + 8 > last_possible_split) {
				// The last character we can split on is one of the first 8 characters of the line
				// to not create very small lines we instead split on the current character
				last_possible_split = character_pos;
			}
			result.push_back(source.substr(start_pos, last_possible_split - start_pos));
			render_width = character_pos - last_possible_split;
			start_pos = last_possible_split;
			character_pos = last_possible_split;
		}
		// check if we can split on this character
		if (CanSplitOnThisChar(source[character_pos])) {
			last_possible_split = character_pos;
		}
		character_pos = next_character_pos;
		render_width += char_render_width;
	}
	if (size > start_pos) {
		// append the remainder of the input
		result.push_back(source.substr(start_pos, size - start_pos));
	}
}